

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::AddSpell(Character *this,short spell)

{
  size_t *psVar1;
  ESF *pEVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  
  if (spell < 1) {
    return false;
  }
  pEVar2 = this->world->esf;
  uVar3 = ((long)(pEVar2->data).
                 super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pEVar2->data).
                 super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if ((ushort)spell <= uVar3 && uVar3 - (ushort)spell != 0) {
    p_Var4 = (this->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while ((p_Var4 != (_List_node_base *)&this->spells &&
           ((int)*(short *)&p_Var4[1]._M_next != (uint)(ushort)spell))) {
      p_Var4 = p_Var4->_M_next;
    }
    if (p_Var4 == (_List_node_base *)&this->spells) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(uint *)&p_Var4[1]._M_next = (uint)(ushort)spell;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      CheckQuestRules(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool Character::AddSpell(short spell)
{
	if (spell <= 0 || std::size_t(spell) >= this->world->esf->data.size())
		return false;

	if (this->HasSpell(spell))
		return false;

	this->spells.push_back(Character_Spell(spell, 0));

	this->CheckQuestRules();

	return true;
}